

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error TT_Vary_Apply_Glyph_Deltas
                   (TT_Face face,FT_UInt glyph_index,FT_Outline *outline,FT_UInt n_points)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ushort uVar5;
  short sVar6;
  FT_ULong *pFVar7;
  long lVar8;
  undefined8 uVar9;
  FT_UInt FVar10;
  FT_UShort FVar11;
  FT_UShort FVar12;
  FT_Vector *pFVar13;
  undefined1 *puVar14;
  FT_Fixed *tuple_coords;
  uchar *puVar15;
  long lVar16;
  FT_Fixed FVar17;
  FT_UShort *pFVar18;
  uchar *puVar19;
  ulong uVar20;
  FT_Pos *pFVar21;
  GX_Blend pGVar22;
  long lVar23;
  long lVar24;
  FT_Memory pFVar25;
  ulong uVar26;
  FT_Vector *pFVar27;
  long *plVar28;
  long *plVar29;
  long lVar30;
  ulong uVar31;
  FT_UInt delta_cnt;
  ulong uVar32;
  int iVar33;
  long lVar34;
  FT_Stream pFVar35;
  ulong uVar36;
  FT_Error error;
  FT_Memory local_170;
  FT_Outline *local_168;
  FT_Vector *local_160;
  FT_UShort local_152;
  undefined1 *local_150;
  FT_Vector *local_148;
  ulong local_140;
  FT_Fixed *local_138;
  FT_Stream local_130;
  int local_124;
  FT_UInt spoint_count;
  FT_UInt point_count;
  ulong local_118;
  FT_Short *local_110;
  FT_Short *local_108;
  FT_Fixed *local_100;
  ulong local_f8;
  GX_Blend local_f0;
  FT_UShort *local_e8;
  FT_Fixed *local_e0;
  FT_UShort *local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  long local_a8;
  FT_Pos *local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  ulong local_80;
  TT_Face local_78;
  FT_Pos *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  uchar *local_50;
  uchar *local_48;
  ulong local_40;
  ulong local_38;
  
  pFVar35 = (face->root).stream;
  local_170 = pFVar35->memory;
  local_f0 = face->blend;
  spoint_count = 0;
  if (local_f0 == (GX_Blend)0x0 || face->doblend == '\0') {
    return 6;
  }
  if (local_f0->gv_glyphcnt <= glyph_index) {
    return 0;
  }
  if (local_f0->glyphoffsets[glyph_index] == local_f0->glyphoffsets[(ulong)glyph_index + 1]) {
    return 0;
  }
  uVar20 = (ulong)n_points;
  local_168 = outline;
  local_78 = face;
  pFVar13 = (FT_Vector *)ft_mem_realloc(local_170,0x10,0,uVar20,(void *)0x0,&error);
  pFVar25 = local_170;
  puVar14 = (undefined1 *)0x0;
  pFVar27 = (FT_Vector *)0x0;
  if (error != 0) goto LAB_0016c851;
  local_160 = pFVar13;
  local_130 = pFVar35;
  local_f8 = (ulong)n_points;
  local_148 = (FT_Vector *)ft_mem_realloc(local_170,0x10,0,uVar20,(void *)0x0,&error);
  if (error != 0) {
    pFVar13 = local_160;
    puVar14 = (undefined1 *)0x0;
    pFVar27 = local_148;
    goto LAB_0016c851;
  }
  puVar14 = (undefined1 *)ft_mem_realloc(pFVar25,1,0,uVar20,(void *)0x0,&error);
  pGVar22 = local_f0;
  pFVar35 = local_130;
  pFVar13 = local_160;
  pFVar25 = local_170;
  pFVar27 = local_148;
  local_150 = puVar14;
  if (((error != 0) ||
      (error = FT_Stream_Seek(local_130,local_f0->glyphoffsets[glyph_index]), pFVar27 = local_148,
      pFVar13 = local_160, puVar14 = local_150, pFVar25 = local_170, error != 0)) ||
     (pFVar7 = pGVar22->glyphoffsets,
     error = FT_Stream_EnterFrame(pFVar35,pFVar7[(ulong)glyph_index + 1] - pFVar7[glyph_index]),
     pFVar25 = local_170, pFVar13 = local_160, puVar14 = local_150, error != 0)) goto LAB_0016c851;
  puVar19 = pFVar35->cursor;
  puVar15 = pFVar35->base;
  local_80 = uVar20;
  tuple_coords = (FT_Fixed *)
                 ft_mem_realloc(local_170,8,0,(ulong)pGVar22->num_axis,(void *)0x0,&error);
  pGVar22 = local_f0;
  local_138 = (FT_Fixed *)0x0;
  local_100 = (FT_Fixed *)0x0;
  pFVar18 = (FT_UShort *)0x0;
  if (error != 0) goto LAB_0016c999;
  local_140 = (long)puVar19 - (long)puVar15;
  local_100 = (FT_Fixed *)ft_mem_realloc(pFVar25,8,0,(ulong)local_f0->num_axis,(void *)0x0,&error);
  if (error == 0) {
    local_138 = (FT_Fixed *)
                ft_mem_realloc(local_170,8,0,(ulong)pGVar22->num_axis,(void *)0x0,&error);
    if (error != 0) goto LAB_0016c991;
    local_e0 = tuple_coords;
    FVar11 = FT_Stream_GetUShort(pFVar35);
    FVar12 = FT_Stream_GetUShort(pFVar35);
    pFVar35 = local_130;
    local_58 = (ulong)(FVar11 & 0xfff);
    uVar20 = pGVar22->gvar_size;
    if (uVar20 < (ulong)FVar12 + local_58 * 4) {
      error = 8;
      tuple_coords = local_e0;
      pFVar25 = local_170;
      pFVar18 = (FT_UShort *)0x0;
      goto LAB_0016c999;
    }
    local_140 = local_140 + FVar12;
    if ((short)FVar11 < 0) {
      puVar19 = local_130->base;
      uVar32 = (long)local_130->cursor - (long)puVar19;
      puVar15 = puVar19 + local_140;
      if ((ulong)((long)local_130->limit - (long)puVar19) <= local_140) {
        puVar15 = local_130->limit;
      }
      local_130->cursor = puVar15;
      local_e8 = ft_var_readpackedpoints(local_130,uVar20,&spoint_count);
      puVar19 = pFVar35->base;
      local_140 = (long)pFVar35->cursor - (long)puVar19;
      puVar15 = puVar19 + uVar32;
      if ((ulong)((long)pFVar35->limit - (long)puVar19) <= uVar32) {
        puVar15 = pFVar35->limit;
      }
      pFVar35->cursor = puVar15;
    }
    else {
      local_e8 = (FT_UShort *)0x0;
    }
    local_a8 = local_80 << 4;
    for (lVar16 = 0; local_a8 != lVar16; lVar16 = lVar16 + 0x10) {
      puVar2 = (undefined8 *)((long)&local_168->points->x + lVar16);
      uVar9 = puVar2[1];
      puVar3 = (undefined8 *)((long)&local_160->x + lVar16);
      *puVar3 = *puVar2;
      puVar3[1] = uVar9;
    }
    iVar33 = (int)local_f8;
    local_b0 = (ulong)(iVar33 - 4);
    local_40 = (ulong)(iVar33 - 3);
    local_60 = (ulong)(iVar33 - 2);
    local_68 = (ulong)(iVar33 - 1);
    local_a0 = &local_148->y;
    local_70 = &local_148[1].y;
    local_b8 = local_b0 << 4;
    local_c0 = local_40 << 4;
    local_c8 = local_60 << 4;
    local_d0 = local_68 << 4;
    local_d8 = (FT_UShort *)0x0;
    pGVar22 = local_f0;
    tuple_coords = local_e0;
    uVar20 = local_140;
    pFVar35 = local_130;
    for (local_124 = 0; local_124 != (int)local_58; local_124 = local_124 + 1) {
      local_152 = FT_Stream_GetUShort(pFVar35);
      FVar11 = FT_Stream_GetUShort(pFVar35);
      local_140 = uVar20;
      if ((short)FVar11 < 0) {
        for (uVar20 = 0; uVar20 < pGVar22->num_axis; uVar20 = uVar20 + 1) {
          FVar12 = FT_Stream_GetUShort(pFVar35);
          tuple_coords[uVar20] = (long)((int)(short)FVar12 << 2);
        }
      }
      else {
        if (pGVar22->tuplecount <= (FVar11 & 0xfff)) {
          error = 8;
          break;
        }
        memcpy(tuple_coords,pGVar22->tuplecoords + (FVar11 & 0xfff) * pGVar22->num_axis,
               (ulong)pGVar22->num_axis << 3);
      }
      if ((FVar11 >> 0xe & 1) != 0) {
        for (uVar20 = 0; uVar32 = (ulong)pGVar22->num_axis, uVar20 < uVar32; uVar20 = uVar20 + 1) {
          FVar12 = FT_Stream_GetUShort(pFVar35);
          local_100[uVar20] = (long)((int)(short)FVar12 << 2);
        }
        for (uVar20 = 0; uVar20 < uVar32; uVar20 = uVar20 + 1) {
          FVar12 = FT_Stream_GetUShort(pFVar35);
          local_138[uVar20] = (long)((int)(short)FVar12 << 2);
          uVar32 = (ulong)pGVar22->num_axis;
        }
      }
      FVar17 = ft_var_apply_tuple(pGVar22,FVar11,tuple_coords,local_100,local_138);
      if (FVar17 != 0) {
        local_50 = pFVar35->base;
        local_48 = pFVar35->cursor;
        puVar19 = local_50 + local_140;
        if ((ulong)((long)pFVar35->limit - (long)local_50) <= local_140) {
          puVar19 = pFVar35->limit;
        }
        pFVar35->cursor = puVar19;
        if ((FVar11 >> 0xd & 1) == 0) {
          point_count = spoint_count;
          pFVar18 = local_e8;
        }
        else {
          pFVar18 = ft_var_readpackedpoints(pFVar35,pGVar22->gvar_size,&point_count);
          local_d8 = pFVar18;
        }
        FVar10 = point_count;
        delta_cnt = point_count;
        if (point_count == 0) {
          delta_cnt = (FT_UInt)local_f8;
        }
        local_110 = ft_var_readpackeddeltas(pFVar35,pGVar22->gvar_size,delta_cnt);
        local_108 = ft_var_readpackeddeltas(pFVar35,pGVar22->gvar_size,delta_cnt);
        if (((pFVar18 != (FT_UShort *)0x0) && (local_108 != (FT_Short *)0x0)) &&
           (local_110 != (FT_Short *)0x0)) {
          iVar33 = (int)FVar17;
          if (pFVar18 == (FT_UShort *)0xffffffffffffffff) {
            lVar16 = 8;
            for (uVar20 = 0; local_80 != uVar20; uVar20 = uVar20 + 1) {
              lVar34 = (long)local_110[uVar20] * (long)iVar33;
              lVar34 = lVar34 + 0x8000 + (lVar34 >> 0x3f) >> 0x10;
              lVar23 = (long)local_108[uVar20] * (long)iVar33;
              lVar23 = lVar23 + 0x8000 + (lVar23 >> 0x3f) >> 0x10;
              if (uVar20 < local_b0) {
                pFVar27 = local_168->points;
                plVar28 = (long *)((long)pFVar27 + lVar16 + -8);
                *plVar28 = *plVar28 + lVar34;
                plVar28 = (long *)((long)&pFVar27->x + lVar16);
                lVar34 = lVar23;
LAB_0016d288:
                *plVar28 = *plVar28 + lVar34;
              }
              else {
                if ((uVar20 == local_b0) && ((local_78->variation_support & 4) == 0)) {
                  plVar28 = (long *)((long)&local_168->points->x + local_b8);
                  goto LAB_0016d288;
                }
                if ((local_40 == uVar20) && ((local_78->variation_support & 2) == 0)) {
                  plVar28 = (long *)((long)&local_168->points->x + local_c0);
                  goto LAB_0016d288;
                }
                if ((local_60 == uVar20) && ((local_78->variation_support & 0x20) == 0)) {
                  pFVar27 = local_168->points;
                  lVar34 = local_c8;
LAB_0016d281:
                  plVar28 = (long *)((long)&pFVar27->y + lVar34);
                  lVar34 = lVar23;
                  goto LAB_0016d288;
                }
                if ((local_68 == uVar20) && ((local_78->variation_support & 0x10) == 0)) {
                  pFVar27 = local_168->points;
                  lVar34 = local_d0;
                  goto LAB_0016d281;
                }
              }
              lVar16 = lVar16 + 0x10;
            }
          }
          else {
            puVar14 = local_150;
            for (lVar16 = 0; local_a8 != lVar16; lVar16 = lVar16 + 0x10) {
              *puVar14 = 0;
              puVar2 = (undefined8 *)((long)&local_160->x + lVar16);
              uVar9 = puVar2[1];
              puVar3 = (undefined8 *)((long)&local_148->x + lVar16);
              *puVar3 = *puVar2;
              puVar3[1] = uVar9;
              puVar14 = puVar14 + 1;
            }
            for (uVar20 = 0; FVar10 != uVar20; uVar20 = uVar20 + 1) {
              uVar5 = pFVar18[uVar20];
              if ((uint)uVar5 < (uint)local_f8) {
                local_150[uVar5] = 1;
                lVar16 = (long)local_110[uVar20] * (long)iVar33;
                local_148[uVar5].x =
                     local_148[uVar5].x + (lVar16 + 0x8000 + (lVar16 >> 0x3f) >> 0x10);
                lVar16 = (long)local_108[uVar20] * (long)iVar33;
                local_148[uVar5].y =
                     local_148[uVar5].y + (lVar16 + 0x8000 + (lVar16 >> 0x3f) >> 0x10);
              }
            }
            pFVar27 = local_160;
            if (local_168->n_contours != 0) {
              lVar16 = 0;
              uVar20 = 0;
              puVar14 = local_150;
              do {
                uVar26 = uVar20 & 0xffffffff;
                sVar6 = local_168->contours[lVar16];
                lVar34 = (long)sVar6;
                uVar31 = (ulong)(int)uVar20;
                uVar32 = lVar34 + 1U;
                if ((long)(lVar34 + 1U) <= (long)uVar31) {
                  uVar32 = uVar31;
                }
                lVar30 = uVar31 << 0x20;
                lVar23 = 0;
LAB_0016cea7:
                uVar4 = uVar31 + lVar23;
                local_38 = uVar20;
                if ((long)uVar4 <= lVar34) {
                  if (puVar14[lVar23 + uVar31] == '\0') goto code_r0x0016ceba;
                  uVar32 = uVar4 & 0xffffffff;
                  uVar20 = uVar4;
                  uVar36 = uVar26 + lVar23;
                  local_90 = lVar23;
                  local_88 = uVar26;
                  while (pFVar13 = local_148, pFVar27 = local_160, iVar33 = (int)uVar32,
                        (long)uVar20 < lVar34) {
                    uVar1 = uVar20 + 1;
                    lVar8 = uVar20 + 1;
                    uVar20 = uVar1;
                    if (puVar14[lVar8] != '\0') {
                      local_118 = uVar36;
                      tt_delta_interpolate
                                (iVar33 + 1,(int)uVar1 + -1,iVar33,(int)uVar1,local_160,local_148);
                      uVar32 = uVar1 & 0xffffffff;
                      lVar23 = local_90;
                      uVar26 = local_88;
                      puVar14 = local_150;
                      uVar36 = local_118;
                    }
                  }
                  uVar32 = (ulong)((int)uVar20 + 1);
                  if ((int)lVar23 + ((int)uVar26 - iVar33) == 0) {
                    lVar24 = lVar30 >> 0x1c;
                    lVar23 = *(long *)((long)&local_148->y + lVar24);
                    lVar8 = *(long *)((long)&local_160->y + lVar24);
                    lVar24 = *(long *)((long)&local_148->x + lVar24) -
                             *(long *)((long)&local_160->x + lVar24);
                    if ((lVar24 != 0) || (lVar23 != lVar8)) {
                      lVar30 = lVar30 >> 0x20;
                      lVar23 = lVar23 - lVar8;
                      pFVar21 = local_a0 + uVar31 * 2;
                      for (; (long)uVar31 < lVar30; uVar31 = uVar31 + 1) {
                        ((FT_Vector *)(pFVar21 + -1))->x = ((FT_Vector *)(pFVar21 + -1))->x + lVar24
                        ;
                        *pFVar21 = *pFVar21 + lVar23;
                        pFVar21 = pFVar21 + 2;
                      }
                      pFVar21 = local_70 + lVar30 * 2;
                      for (; lVar30 < lVar34; lVar30 = lVar30 + 1) {
                        ((FT_Vector *)(pFVar21 + -1))->x = ((FT_Vector *)(pFVar21 + -1))->x + lVar24
                        ;
                        *pFVar21 = *pFVar21 + lVar23;
                        pFVar21 = pFVar21 + 2;
                      }
                    }
                  }
                  else {
                    local_118 = uVar32;
                    local_98 = lVar16;
                    tt_delta_interpolate
                              (iVar33 + 1,(int)sVar6,iVar33,(int)uVar36,local_160,local_148);
                    lVar16 = local_98;
                    uVar32 = local_118;
                    puVar14 = local_150;
                    if (0 < (long)uVar4) {
                      tt_delta_interpolate
                                ((int)local_88,(int)local_38 + (int)local_90 + -1,iVar33,(int)uVar36
                                 ,pFVar27,pFVar13);
                      lVar16 = local_98;
                      uVar32 = local_118;
                      puVar14 = local_150;
                    }
                  }
                }
                lVar16 = lVar16 + 1;
                uVar20 = uVar32;
                if (local_168->n_contours <= lVar16) break;
              } while( true );
            }
            uVar20 = 0;
            for (lVar16 = 0; pFVar35 = local_130, local_a8 != lVar16; lVar16 = lVar16 + 0x10) {
              lVar34 = *(long *)((long)local_a0 + lVar16 + -8) -
                       *(long *)((long)&pFVar27->x + lVar16);
              lVar23 = *(long *)((long)local_a0 + lVar16) - *(long *)((long)&pFVar27->y + lVar16);
              if (uVar20 < local_b0) {
                plVar29 = (long *)((long)&local_168->points->x + lVar16);
                plVar28 = plVar29 + 1;
                *plVar29 = *plVar29 + lVar34;
                lVar34 = lVar23;
LAB_0016d169:
                *plVar28 = *plVar28 + lVar34;
              }
              else {
                if ((local_b8 == lVar16) && ((local_78->variation_support & 4) == 0)) {
                  plVar28 = (long *)((long)&local_168->points->x + local_b8);
                  goto LAB_0016d169;
                }
                if ((local_c0 == lVar16) && ((local_78->variation_support & 2) == 0)) {
                  plVar28 = (long *)((long)&local_168->points->x + local_c0);
                  goto LAB_0016d169;
                }
                if ((local_c8 == lVar16) && ((local_78->variation_support & 0x20) == 0)) {
                  pFVar13 = local_168->points;
                  lVar34 = local_c8;
LAB_0016d162:
                  plVar28 = (long *)((long)&pFVar13->y + lVar34);
                  lVar34 = lVar23;
                  goto LAB_0016d169;
                }
                if ((local_d0 == lVar16) && ((local_78->variation_support & 0x10) == 0)) {
                  pFVar13 = local_168->points;
                  lVar34 = local_d0;
                  goto LAB_0016d162;
                }
              }
              uVar20 = uVar20 + 1;
            }
          }
        }
        pFVar18 = (FT_UShort *)0xffffffffffffffff;
        if (local_d8 != (FT_UShort *)0xffffffffffffffff) {
          ft_mem_free(local_170,local_d8);
          pFVar18 = (FT_UShort *)0x0;
        }
        pFVar25 = local_170;
        uVar20 = (long)local_48 - (long)local_50;
        ft_mem_free(local_170,local_110);
        ft_mem_free(pFVar25,local_108);
        puVar19 = pFVar35->base + uVar20;
        if ((ulong)((long)pFVar35->limit - (long)pFVar35->base) <= uVar20) {
          puVar19 = pFVar35->limit;
        }
        pFVar35->cursor = puVar19;
        pGVar22 = local_f0;
        tuple_coords = local_e0;
        local_d8 = pFVar18;
      }
      uVar20 = local_140 + local_152;
    }
    pFVar25 = local_170;
    pFVar18 = local_e8;
    if (local_e8 != (FT_UShort *)0xffffffffffffffff) goto LAB_0016c999;
  }
  else {
    local_138 = (FT_Fixed *)0x0;
LAB_0016c991:
    pFVar25 = local_170;
    pFVar18 = (FT_UShort *)0x0;
LAB_0016c999:
    ft_mem_free(pFVar25,pFVar18);
  }
  ft_mem_free(local_170,tuple_coords);
  ft_mem_free(local_170,local_100);
  ft_mem_free(local_170,local_138);
  FT_Stream_ExitFrame(pFVar35);
  pFVar13 = local_160;
  puVar14 = local_150;
  pFVar25 = local_170;
  pFVar27 = local_148;
LAB_0016c851:
  ft_mem_free(pFVar25,pFVar13);
  ft_mem_free(pFVar25,pFVar27);
  ft_mem_free(pFVar25,puVar14);
  return error;
code_r0x0016ceba:
  lVar23 = lVar23 + 1;
  lVar30 = lVar30 + 0x100000000;
  goto LAB_0016cea7;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Vary_Apply_Glyph_Deltas( TT_Face      face,
                              FT_UInt      glyph_index,
                              FT_Outline*  outline,
                              FT_UInt      n_points )
  {
    FT_Stream   stream = face->root.stream;
    FT_Memory   memory = stream->memory;
    GX_Blend    blend  = face->blend;

    FT_Vector*  points_org = NULL;
    FT_Vector*  points_out = NULL;
    FT_Bool*    has_delta  = NULL;

    FT_Error    error;
    FT_ULong    glyph_start;
    FT_UInt     tupleCount;
    FT_ULong    offsetToData;
    FT_ULong    here;
    FT_UInt     i, j;
    FT_Fixed*   tuple_coords    = NULL;
    FT_Fixed*   im_start_coords = NULL;
    FT_Fixed*   im_end_coords   = NULL;
    FT_UInt     point_count, spoint_count = 0;
    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;
    FT_Short    *deltas_x, *deltas_y;


    if ( !face->doblend || !blend )
      return FT_THROW( Invalid_Argument );

    if ( glyph_index >= blend->gv_glyphcnt      ||
         blend->glyphoffsets[glyph_index] ==
           blend->glyphoffsets[glyph_index + 1] )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " no variation data for this glyph\n" ));
      return FT_Err_Ok;
    }

    if ( FT_NEW_ARRAY( points_org, n_points ) ||
         FT_NEW_ARRAY( points_out, n_points ) ||
         FT_NEW_ARRAY( has_delta, n_points )  )
      goto Fail1;

    if ( FT_STREAM_SEEK( blend->glyphoffsets[glyph_index] )   ||
         FT_FRAME_ENTER( blend->glyphoffsets[glyph_index + 1] -
                           blend->glyphoffsets[glyph_index] ) )
      goto Fail1;

    glyph_start = FT_Stream_FTell( stream );

    /* each set of glyph variation data is formatted similarly to `cvar' */

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto Fail2;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData + ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 >
           blend->gvar_size )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " invalid glyph variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto Fail2;
    }

    offsetToData += glyph_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              blend->gvar_size,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "gvar: there %s %d tuple%s:\n",
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "is" : "are",
                tupleCount & GX_TC_TUPLE_COUNT_MASK,
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "" : "s" ));

    for ( j = 0; j < n_points; j++ )
      points_org[j] = outline->points[j];

    for ( i = 0; i < ( tupleCount & GX_TC_TUPLE_COUNT_MASK ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_GET_SHORT() * 4;   /* convert from        */
                                                  /* short frac to fixed */
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Fail2;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          &blend->tuplecoords[( tupleIndex & 0xFFF ) * blend->num_axis],
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_GET_SHORT() * 4;
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_GET_SHORT() * 4;
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               blend->gvar_size,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas_x = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );
      deltas_y = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );

      if ( !points || !deltas_y || !deltas_x )
        ; /* failure, ignore it */

      else if ( points == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    point deltas:\n" ));

        /* this means that there are deltas for every point in the glyph */
        for ( j = 0; j < n_points; j++ )
        {
          FT_Pos  delta_x = FT_MulFix( deltas_x[j], apply );
          FT_Pos  delta_y = FT_MulFix( deltas_y[j], apply );


          if ( j < n_points - 4 )
          {
            outline->points[j].x += delta_x;
            outline->points[j].y += delta_y;
          }
          else
          {
            /* To avoid double adjustment of advance width or height, */
            /* adjust phantom points only if there is no HVAR or VVAR */
            /* support, respectively.                                 */
            if ( j == ( n_points - 4 )        &&
                 !( face->variation_support &
                    TT_FACE_FLAG_VAR_LSB    ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 3 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_HADVANCE ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 2 )        &&
                      !( face->variation_support &
                         TT_FACE_FLAG_VAR_TSB    ) )
              outline->points[j].y += delta_y;

            else if ( j == ( n_points - 1 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_VADVANCE ) )
              outline->points[j].y += delta_y;
          }

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( delta_x || delta_y )
          {
            FT_TRACE7(( "      %d: (%d, %d) -> (%d, %d)\n",
                        j,
                        outline->points[j].x - delta_x,
                        outline->points[j].y - delta_y,
                        outline->points[j].x,
                        outline->points[j].y ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        /* we have to interpolate the missing deltas similar to the */
        /* IUP bytecode instruction                                 */
        for ( j = 0; j < n_points; j++ )
        {
          has_delta[j]  = FALSE;
          points_out[j] = points_org[j];
        }

        for ( j = 0; j < point_count; j++ )
        {
          FT_UShort  idx = points[j];


          if ( idx >= n_points )
            continue;

          has_delta[idx] = TRUE;

          points_out[idx].x += FT_MulFix( deltas_x[j], apply );
          points_out[idx].y += FT_MulFix( deltas_y[j], apply );
        }

        /* no need to handle phantom points here,      */
        /* since solitary points can't be interpolated */
        tt_interpolate_deltas( outline,
                               points_out,
                               points_org,
                               has_delta );

        FT_TRACE7(( "    point deltas:\n" ));

        for ( j = 0; j < n_points; j++ )
        {
          FT_Pos  delta_x = points_out[j].x - points_org[j].x;
          FT_Pos  delta_y = points_out[j].y - points_org[j].y;


          if ( j < n_points - 4 )
          {
            outline->points[j].x += delta_x;
            outline->points[j].y += delta_y;
          }
          else
          {
            /* To avoid double adjustment of advance width or height, */
            /* adjust phantom points only if there is no HVAR or VVAR */
            /* support, respectively.                                 */
            if ( j == ( n_points - 4 )        &&
                 !( face->variation_support &
                    TT_FACE_FLAG_VAR_LSB    ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 3 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_HADVANCE ) )
              outline->points[j].x += delta_x;

            else if ( j == ( n_points - 2 )        &&
                      !( face->variation_support &
                         TT_FACE_FLAG_VAR_TSB    ) )
              outline->points[j].y += delta_y;

            else if ( j == ( n_points - 1 )          &&
                      !( face->variation_support   &
                         TT_FACE_FLAG_VAR_VADVANCE ) )
              outline->points[j].y += delta_y;
          }

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( delta_x || delta_y )
          {
            FT_TRACE7(( "      %d: (%d, %d) -> (%d, %d)\n",
                        j,
                        outline->points[j].x - delta_x,
                        outline->points[j].y - delta_y,
                        outline->points[j].x,
                        outline->points[j].y ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas_x );
      FT_FREE( deltas_y );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

  Fail2:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    FT_FRAME_EXIT();

  Fail1:
    FT_FREE( points_org );
    FT_FREE( points_out );
    FT_FREE( has_delta );

    return error;
  }